

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

optional<bool> __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
::
remove_or_choose_subtree<std::optional<bool>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::optimistic_lock::read_critical_section&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>**,unodb::optimistic_lock::read_critical_section*,unodb::node_type*,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>*>
          (basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
           *this,node_type type,byte *args,
          basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *args_1,
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *args_2,read_critical_section *args_3,read_critical_section *args_4,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **args_5,in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                   ***args_6,read_critical_section **args_7,node_type **args_8,
          basic_node_ptr<unodb::detail::olc_node_header> **args_9)

{
  _Optional_base<bool,_true,_true> _Var1;
  olc_node_ptr *unaff_RBX;
  undefined7 in_register_00000031;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_00;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_01;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_02;
  
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    remove_or_choose_subtree<std::optional<bool>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::optimistic_lock::read_critical_section&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>**,unodb::optimistic_lock::read_critical_section*,unodb::node_type*,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>*>
              ();
  default:
    remove_or_choose_subtree<std::optional<bool>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::optimistic_lock::read_critical_section&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>**,unodb::optimistic_lock::read_critical_section*,unodb::node_type*,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>*>
              ();
  case 1:
    k.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)(__extent_storage<18446744073709551615UL>)args_2;
    k.field_0.key._M_ptr = (pointer)(args_1->field_0).key._M_extent._M_extent_value;
    _Var1._M_payload.super__Optional_payload_base<bool> =
         (_Optional_payload<bool,_true,_true,_true>)
         olc_impl_helpers::
         remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                   ((olc_impl_helpers *)this,
                    (olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)(ulong)*args,(byte)*(undefined8 *)&args_1->field_0,k,
                    (olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)args_3,args_4,(read_critical_section *)*args_5,
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)*args_6,
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     **)*args_7,(read_critical_section *)*args_8,(node_type *)*args_9,unaff_RBX);
    break;
  case 2:
    k_00.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)(__extent_storage<18446744073709551615UL>)args_2;
    k_00.field_0.key._M_ptr = (pointer)(args_1->field_0).key._M_extent._M_extent_value;
    _Var1._M_payload.super__Optional_payload_base<bool> =
         (_Optional_payload<bool,_true,_true,_true>)
         olc_impl_helpers::
         remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                   ((olc_impl_helpers *)this,
                    (olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)(ulong)*args,(byte)*(undefined8 *)&args_1->field_0,k_00,
                    (olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)args_3,args_4,(read_critical_section *)*args_5,
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)*args_6,
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     **)*args_7,(read_critical_section *)*args_8,(node_type *)*args_9,unaff_RBX);
    break;
  case 3:
    k_02.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)(__extent_storage<18446744073709551615UL>)args_2;
    k_02.field_0.key._M_ptr = (pointer)(args_1->field_0).key._M_extent._M_extent_value;
    _Var1._M_payload.super__Optional_payload_base<bool> =
         (_Optional_payload<bool,_true,_true,_true>)
         olc_impl_helpers::
         remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                   ((olc_impl_helpers *)this,
                    (olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)(ulong)*args,(byte)*(undefined8 *)&args_1->field_0,k_02,
                    (olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)args_3,args_4,(read_critical_section *)*args_5,
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)*args_6,
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     **)*args_7,(read_critical_section *)*args_8,(node_type *)*args_9,unaff_RBX);
    break;
  case 4:
    k_01.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)(__extent_storage<18446744073709551615UL>)args_2;
    k_01.field_0.key._M_ptr = (pointer)(args_1->field_0).key._M_extent._M_extent_value;
    _Var1._M_payload.super__Optional_payload_base<bool> =
         (_Optional_payload<bool,_true,_true,_true>)
         olc_impl_helpers::
         remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                   ((olc_impl_helpers *)this,
                    (olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)(ulong)*args,(byte)*(undefined8 *)&args_1->field_0,k_01,
                    (olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)args_3,args_4,(read_critical_section *)*args_5,
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)*args_6,
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     **)*args_7,(read_critical_section *)*args_8,(node_type *)*args_9,unaff_RBX);
  }
  return (_Optional_base<bool,_true,_true>)
         (_Optional_base<bool,_true,_true>)_Var1._M_payload.super__Optional_payload_base<bool>;
}

Assistant:

[[nodiscard]] ReturnType remove_or_choose_subtree(node_type type,
                                                    Args &&...args) {
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }